

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseLowPrecedenceExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t selector;
  sysbvm_tuple_t argument_00;
  sysbvm_tuple_t sourcePosition;
  _Bool local_41;
  size_t endPosition;
  sysbvm_tuple_t argument;
  sysbvm_tuple_t binaryOperator;
  sysbvm_tuple_t lastExpression;
  size_t startPosition;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  startIndex = state->tokenPosition;
  binaryOperator = sysbvm_parser_parseChainExpression(context,state);
  while( true ) {
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    local_41 = false;
    if (iVar1 == 0x13) {
      iVar1 = sysbvm_parser_lookKindAt(state,1);
      local_41 = sysbvm_parser_isBinaryExpressionOperator(iVar1);
    }
    if (local_41 == false) break;
    state->tokenPosition = state->tokenPosition + 1;
    selector = sysbvm_parser_parseLiteralTokenValue(context,state);
    argument_00 = sysbvm_parser_parseChainExpression(context,state);
    sourcePosition =
         sysbvm_parser_makeSourcePositionForTokenRange
                   (context,state->sourceCode,state->tokenSequence,startIndex,state->tokenPosition);
    binaryOperator =
         sysbvm_parser_makeBinaryMessageSend
                   (context,sourcePosition,binaryOperator,selector,argument_00);
  }
  return binaryOperator;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseLowPrecedenceExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    size_t startPosition = state->tokenPosition;
    sysbvm_tuple_t lastExpression = sysbvm_parser_parseChainExpression(context, state);
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COLON_COLON && sysbvm_parser_isBinaryExpressionOperator(sysbvm_parser_lookKindAt(state, 1)))
    {
        ++state->tokenPosition;
        sysbvm_tuple_t binaryOperator = sysbvm_parser_parseLiteralTokenValue(context, state);

        sysbvm_tuple_t argument = sysbvm_parser_parseChainExpression(context, state);
        size_t endPosition = state->tokenPosition;
        lastExpression = sysbvm_parser_makeBinaryMessageSend(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), lastExpression, binaryOperator, argument);
    }
    
    return lastExpression;
}